

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkRefUtil.cpp
# Opt level: O3

Move<vk::VkCommandBuffer_s_*> *
vk::allocateCommandBuffer
          (Move<vk::VkCommandBuffer_s_*> *__return_storage_ptr__,DeviceInterface *vk,VkDevice device
          ,VkCommandPool commandPool,VkCommandBufferLevel level)

{
  VkCommandBufferAllocateInfo allocInfo;
  VkCommandBufferAllocateInfo local_28;
  
  local_28.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_28.pNext = (void *)0x0;
  local_28.commandBufferCount = 1;
  local_28.commandPool.m_internal = commandPool.m_internal;
  local_28.level = level;
  allocateCommandBuffer(__return_storage_ptr__,vk,device,&local_28);
  return __return_storage_ptr__;
}

Assistant:

Move<VkCommandBuffer> allocateCommandBuffer (const DeviceInterface&	vk,
											 VkDevice				device,
											 VkCommandPool			commandPool,
											 VkCommandBufferLevel	level)
{
	const VkCommandBufferAllocateInfo allocInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
		DE_NULL,

		commandPool,
		level,
		1
	};

	return allocateCommandBuffer(vk, device, &allocInfo);
}